

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O2

Maybe<kj::Url> *
kj::Url::tryParse(Maybe<kj::Url> *__return_storage_ptr__,StringPtr text,Context context,
                 Options options)

{
  Options OVar1;
  bool bVar2;
  anon_unknown_0 *this;
  char *pcVar3;
  char *pcVar4;
  Options *in_R9;
  ArrayPtr<const_char> AVar5;
  ArrayPtr<const_char> text_00;
  ArrayPtr<const_char> text_01;
  ArrayPtr<const_char> text_02;
  ArrayPtr<const_char> text_03;
  ArrayPtr<const_char> text_04;
  ArrayPtr<const_char> text_05;
  ArrayPtr<const_char> text_06;
  ArrayPtr<const_char> text_07;
  ArrayPtr<const_char> text_08;
  ArrayPtr<const_char> text_09;
  bool err;
  Options options_local;
  StringPtr local_1c0;
  NullableValue<kj::ArrayPtr<const_char>_> _userpass204;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Array<char> local_158;
  NullableValue<kj::Url> *local_140;
  CharGroup_ *local_138;
  CharGroup_ *local_130;
  ArrayPtr<const_char> authority;
  Url local_118;
  
  local_1c0.content.size_ = text.content.size_;
  local_1c0.content.ptr = text.content.ptr;
  local_118.scheme.content.disposer._0_1_ = 0;
  local_118._17_8_ = 0;
  local_118.scheme.content.ptr = (char *)0x0;
  local_118.scheme.content.size_._0_1_ = 0;
  local_118.scheme.content.size_._1_7_ = 0;
  local_118.host.content.ptr = (char *)0x0;
  local_118.host.content.size_ = 0;
  local_118.host.content.disposer = (ArrayDisposer *)0x0;
  local_118.path.builder.ptr = (String *)0x0;
  local_118.path.builder.pos = (RemoveConst<kj::String> *)0x0;
  local_118.path.builder.endPtr = (String *)0x0;
  local_118.path.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_118.hasTrailingSlash = false;
  local_118.query.builder.ptr = (QueryParam *)0x0;
  local_118.query.builder.pos = (RemoveConst<kj::Url::QueryParam> *)0x0;
  local_118.query.builder.endPtr = (QueryParam *)0x0;
  local_118.query.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_118.fragment.ptr.isSet = false;
  err = false;
  options_local = options;
  local_118.options = options;
  local_130 = anon_unknown_0::getEndPathPart(context);
  local_138 = anon_unknown_0::getEndQueryPart(context);
  if (context == HTTP_REQUEST) {
    _kjCondition.left =
         (long)"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" + 0x3f;
    _kjCondition.right = 2;
    _kjCondition._12_4_ = 0;
    bVar2 = StringPtr::startsWith(&local_1c0,(StringPtr *)&_kjCondition);
    if (bVar2) {
LAB_00301fe8:
      local_140 = &__return_storage_ptr__->ptr;
      bVar2 = local_118.hasTrailingSlash;
LAB_0030200b:
      local_118.hasTrailingSlash = bVar2;
      _kjCondition.left =
           (long)"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" + 0x3f;
      _kjCondition.right = 2;
      _kjCondition._12_4_ = 0;
      bVar2 = StringPtr::startsWith(&local_1c0,(StringPtr *)&_kjCondition);
      if (!bVar2) goto LAB_003022e3;
      local_1c0.content.ptr = local_1c0.content.ptr + 1;
      local_1c0.content.size_ = local_1c0.content.size_ - 1;
      AVar5 = anon_unknown_0::split(&local_1c0,local_130);
      text_00.ptr = (char *)AVar5.size_;
      this = (anon_unknown_0 *)AVar5.ptr;
      if (text_00.ptr == (char *)0x0) goto LAB_00302094;
      if (text_00.ptr != (char *)0x1) {
        if (((text_00.ptr != (char *)0x2) || (*this != (anon_unknown_0)0x2e)) ||
           (this[1] != (anon_unknown_0)0x2e)) goto LAB_003020a6;
        bVar2 = true;
        if (local_118.path.builder.pos != local_118.path.builder.ptr) {
          local_118.path.builder.pos = local_118.path.builder.pos + -1;
          Array<char>::~Array(&(local_118.path.builder.pos)->content);
        }
        goto LAB_0030200b;
      }
      bVar2 = true;
      if (*this == (anon_unknown_0)0x2e) goto LAB_0030200b;
LAB_003020a6:
      text_00.size_ = (size_t)&err;
      anon_unknown_0::percentDecode
                ((String *)&_kjCondition,this,text_00,&options_local.percentDecode,in_R9);
      Vector<kj::String>::add<kj::String>(&local_118.path,(String *)&_kjCondition);
      Array<char>::~Array((Array<char> *)&_kjCondition);
      bVar2 = false;
      goto LAB_0030200b;
    }
  }
  else {
    StringPtr::findFirst((StringPtr *)&_userpass204,(char)&local_1c0);
    if (_userpass204.isSet == true) {
      local_1c0.content.size_ = local_1c0.content.size_ - (long)(_userpass204.field_1.value.ptr + 1)
      ;
      _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,1);
      _kjCondition._8_8_ = local_1c0.content.ptr;
      _kjCondition.op.content.ptr = _userpass204.field_1.value.ptr;
      local_1c0.content.ptr = local_1c0.content.ptr + (long)_userpass204.field_1.value.ptr + 1;
      str<kj::ArrayPtr<char_const>&>
                ((String *)&_userpass204,(kj *)&_kjCondition.right,
                 (ArrayPtr<const_char> *)(_userpass204.field_1.value.ptr + 1));
      Array<char>::operator=((Array<char> *)&local_118,(Array<char> *)&_userpass204);
      Array<char>::~Array((Array<char> *)&_userpass204);
      anon_unknown_0::toLower(&local_118.scheme);
      if (((1 < CONCAT71(local_118.scheme.content.size_._1_7_,
                         (undefined1)local_118.scheme.content.size_)) &&
          ((*(ulong *)((anonymous_namespace)::ALPHAS +
                      (ulong)((byte)*local_118.scheme.content.ptr >> 6) * 8) >>
            ((ulong)(byte)*local_118.scheme.content.ptr & 0x3f) & 1) != 0)) &&
         (AVar5.ptr = (byte *)(local_118.scheme.content.ptr + 1),
         AVar5.size_ = CONCAT71(local_118.scheme.content.size_._1_7_,
                                (undefined1)local_118.scheme.content.size_) - 2,
         bVar2 = kj::parse::CharGroup_::containsAll
                           ((CharGroup_ *)(anonymous_namespace)::SCHEME_CHARS,AVar5), bVar2)) {
        _kjCondition.left = (long)"://" + 1;
        _kjCondition.right = 3;
        _kjCondition._12_4_ = 0;
        bVar2 = StringPtr::startsWith(&local_1c0,(StringPtr *)&_kjCondition);
        if (bVar2) {
          local_1c0.content.ptr = local_1c0.content.ptr + 2;
          local_1c0.content.size_ = local_1c0.content.size_ - 2;
          authority = anon_unknown_0::split
                                (&local_1c0,(CharGroup_ *)(anonymous_namespace)::END_AUTHORITY);
          anon_unknown_0::trySplit((Maybe<kj::ArrayPtr<const_char>_> *)&_kjCondition,&authority,'@')
          ;
          _userpass204.isSet = (bool)(char)_kjCondition.left;
          if ((bool)(char)_kjCondition.left != false) {
            _userpass204.field_1.value.ptr = (char *)_kjCondition._8_8_;
            _userpass204.field_1.value.size_ = (size_t)_kjCondition.op.content.ptr;
            if (context != REMOTE_HREF) goto LAB_003024cf;
            anon_unknown_0::trySplit
                      ((Maybe<kj::ArrayPtr<const_char>_> *)&_kjCondition,&_userpass204.field_1.value
                       ,':');
            if ((char)_kjCondition.left == '\x01') {
              text_01.size_ = (size_t)&err;
              text_01.ptr = _kjCondition.op.content.ptr;
              anon_unknown_0::percentDecode
                        ((String *)&_kjCondition,(anon_unknown_0 *)_kjCondition._8_8_,text_01,
                         &options_local.percentDecode,in_R9);
              text_02.size_ = (size_t)&err;
              text_02.ptr = (char *)_userpass204.field_1.value.size_;
              anon_unknown_0::percentDecode
                        ((String *)&local_158,(anon_unknown_0 *)_userpass204.field_1.value.ptr,
                         text_02,&options_local.percentDecode,in_R9);
              _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,1);
              _kjCondition._32_8_ = local_158.ptr;
              local_158.ptr = (char *)0x0;
              local_158.size_ = 0;
              kj::_::NullableValue<kj::Url::UserInfo>::emplace<kj::Url::UserInfo>
                        (&local_118.userInfo.ptr,(UserInfo *)&_kjCondition);
              UserInfo::~UserInfo((UserInfo *)&_kjCondition);
              Array<char>::~Array(&local_158);
            }
            else {
              text_07.size_ = (size_t)&err;
              text_07.ptr = (char *)_userpass204.field_1.value.size_;
              anon_unknown_0::percentDecode
                        ((String *)&_kjCondition,(anon_unknown_0 *)_userpass204.field_1.value.ptr,
                         text_07,&options_local.percentDecode,in_R9);
              _kjCondition.op.content.size_ = _kjCondition.op.content.size_ & 0xffffffffffffff00;
              kj::_::NullableValue<kj::Url::UserInfo>::emplace<kj::Url::UserInfo>
                        (&local_118.userInfo.ptr,(UserInfo *)&_kjCondition);
              UserInfo::~UserInfo((UserInfo *)&_kjCondition);
            }
          }
          text_08.size_ = (size_t)&err;
          text_08.ptr = (char *)authority.size_;
          anon_unknown_0::percentDecode
                    ((String *)&_kjCondition,(anon_unknown_0 *)authority.ptr,text_08,
                     &options_local.percentDecode,in_R9);
          Array<char>::operator=(&local_118.host.content,(Array<char> *)&_kjCondition);
          Array<char>::~Array((Array<char> *)&_kjCondition);
          pcVar4 = (char *)local_118.host.content.size_;
          if ((char *)local_118.host.content.size_ != (char *)0x0) {
            pcVar4 = local_118.host.content.ptr;
          }
          pcVar3 = (char *)0x0;
          if ((char *)local_118.host.content.size_ != (char *)0x0) {
            pcVar3 = (char *)(local_118.host.content.size_ + -1);
          }
          text_09.size_ = (size_t)pcVar3;
          text_09.ptr = pcVar4;
          bVar2 = kj::parse::CharGroup_::containsAll
                            ((CharGroup_ *)(anonymous_namespace)::HOST_CHARS,text_09);
          if (bVar2) {
            anon_unknown_0::toLower(&local_118.host);
            goto LAB_00301fe8;
          }
        }
      }
    }
  }
  goto LAB_003024cf;
LAB_00302094:
  bVar2 = true;
  if ((options_local.allowEmpty != true) || (local_1c0.content.size_ == 1)) goto LAB_0030200b;
  goto LAB_003020a6;
LAB_003022e3:
  _kjCondition.left =
       (long)"\'/\' character in path component; did you mean to use Path::parse()?" + 0x42;
  _kjCondition.right = 2;
  _kjCondition._12_4_ = 0;
  bVar2 = StringPtr::startsWith(&local_1c0,(StringPtr *)&_kjCondition);
  OVar1 = options_local;
  if (bVar2) {
    do {
      local_1c0.content.ptr = local_1c0.content.ptr + 1;
      local_1c0.content.size_ = local_1c0.content.size_ - 1;
      _userpass204._0_16_ = anon_unknown_0::split(&local_1c0,local_138);
      if ((_userpass204.field_1._0_8_ != 0) || (((ushort)OVar1 & 0x100) != 0)) {
        anon_unknown_0::trySplit
                  ((Maybe<kj::ArrayPtr<const_char>_> *)&_kjCondition,
                   (ArrayPtr<const_char> *)&_userpass204,'=');
        if ((char)_kjCondition.left == '\x01') {
          text_03.size_ = (size_t)&err;
          text_03.ptr = _kjCondition.op.content.ptr;
          anon_unknown_0::percentDecodeQuery
                    ((String *)&_kjCondition,(anon_unknown_0 *)_kjCondition._8_8_,text_03,
                     &options_local.percentDecode,in_R9);
          text_04.size_ = (size_t)&err;
          text_04.ptr = _userpass204.field_1.value.ptr;
          anon_unknown_0::percentDecodeQuery
                    ((String *)&_kjCondition.op.content.size_,(anon_unknown_0 *)_userpass204._0_8_,
                     text_04,&options_local.percentDecode,in_R9);
          Vector<kj::Url::QueryParam>::add<kj::Url::QueryParam>
                    (&local_118.query,(QueryParam *)&_kjCondition);
        }
        else {
          text_05.size_ = (size_t)&err;
          text_05.ptr = _userpass204.field_1.value.ptr;
          anon_unknown_0::percentDecodeQuery
                    ((String *)&_kjCondition,(anon_unknown_0 *)_userpass204._0_8_,text_05,
                     &options_local.percentDecode,in_R9);
          _kjCondition.op.content.size_ = 0;
          _kjCondition.result = false;
          _kjCondition._33_7_ = 0;
          Vector<kj::Url::QueryParam>::add<kj::Url::QueryParam>
                    (&local_118.query,(QueryParam *)&_kjCondition);
        }
        QueryParam::~QueryParam((QueryParam *)&_kjCondition);
      }
      _kjCondition.left = (long)"$foo&" + 4;
      _kjCondition.right = 2;
      _kjCondition._12_4_ = 0;
      bVar2 = StringPtr::startsWith(&local_1c0,(StringPtr *)&_kjCondition);
    } while (bVar2);
  }
  _kjCondition.left = (long)"*** Received signal #" + 0x14;
  _kjCondition.right = 2;
  _kjCondition._12_4_ = 0;
  bVar2 = StringPtr::startsWith(&local_1c0,(StringPtr *)&_kjCondition);
  __return_storage_ptr__ = (Maybe<kj::Url> *)local_140;
  if (bVar2) {
    if (context != REMOTE_HREF) goto LAB_003024cf;
    text_06.ptr = (char *)(local_1c0.content.size_ - 2);
    text_06.size_ = (size_t)&err;
    anon_unknown_0::percentDecode
              ((String *)&_kjCondition,(anon_unknown_0 *)(local_1c0.content.ptr + 1),text_06,
               &options_local.percentDecode,in_R9);
    kj::_::NullableValue<kj::String>::emplace<kj::String>
              (&local_118.fragment.ptr,(String *)&_kjCondition);
    Array<char>::~Array((Array<char> *)&_kjCondition);
  }
  else {
    _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
    _kjCondition.left = local_1c0.content.size_ - 1;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == 0;
    if (_kjCondition.left != 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                ((Fault *)&_userpass204,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/url.c++"
                 ,0x10e,FAILED,"text.size() == 0","_kjCondition,",&_kjCondition);
      kj::_::Debug::Fault::fatal((Fault *)&_userpass204);
    }
  }
  if (err != true) {
    kj::_::NullableValue<kj::Url>::NullableValue(&__return_storage_ptr__->ptr,&local_118);
    goto LAB_003024d3;
  }
LAB_003024cf:
  ((NullableValue<kj::Url> *)&(__return_storage_ptr__->ptr).isSet)->isSet = false;
LAB_003024d3:
  ~Url(&local_118);
  return (Maybe<kj::Url> *)&__return_storage_ptr__->ptr;
}

Assistant:

Maybe<Url> Url::tryParse(StringPtr text, Context context, Options options) {
  Url result;
  result.options = options;
  bool err = false;  // tracks percent-decoding errors

  auto& END_PATH_PART = getEndPathPart(context);
  auto& END_QUERY_PART = getEndQueryPart(context);

  if (context == HTTP_REQUEST) {
    if (!text.startsWith("/")) {
      return kj::none;
    }
  } else {
    KJ_IF_SOME(scheme, trySplit(text, ':')) {
      result.scheme = kj::str(scheme);
    } else {
      // missing scheme
      return kj::none;
    }
    toLower(result.scheme);
    if (result.scheme.size() == 0 ||
        !ALPHAS.contains(result.scheme[0]) ||
        !SCHEME_CHARS.containsAll(result.scheme.slice(1))) {
      // bad scheme
      return kj::none;
    }

    if (!text.startsWith("//")) {
      // We require an authority (hostname) part.
      return kj::none;
    }
    text = text.slice(2);

    {
      auto authority = split(text, END_AUTHORITY);

      KJ_IF_SOME(userpass, trySplit(authority, '@')) {
        if (context != REMOTE_HREF) {
          // No user/pass allowed here.
          return kj::none;
        }
        KJ_IF_SOME(username, trySplit(userpass, ':')) {
          result.userInfo = UserInfo {
            percentDecode(username, err, options),
            percentDecode(userpass, err, options)
          };
        } else {
          result.userInfo = UserInfo {
            percentDecode(userpass, err, options),
            kj::none
          };
        }
      }

      result.host = percentDecode(authority, err, options);
      if (!HOST_CHARS.containsAll(result.host)) return kj::none;
      toLower(result.host);
    }